

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexStats.cpp
# Opt level: O3

RegexStats * __thiscall
UnifiedRegex::RegexStatsDatabase::GetRegexStats(RegexStatsDatabase *this,RegexPattern *pattern)

{
  BaseDictionary<Js::InternalString,_UnifiedRegex::RegexStats_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  uint uVar1;
  RegexStats *this_01;
  Type *value;
  undefined1 local_40 [8];
  InternalString str;
  
  RegexPattern::GetSource((RegexPattern *)local_40);
  this_00 = this->map;
  uVar1 = JsUtil::
          BaseDictionary<Js::InternalString,_UnifiedRegex::RegexStats_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
          ::FindEntryWithKey<Js::InternalString>(this_00,(InternalString *)local_40);
  if ((int)uVar1 < 0) {
    this_01 = (RegexStats *)new<Memory::ArenaAllocator>(0x80,this->allocator,0x364470);
    RegexStats::RegexStats(this_01,pattern);
    value = &str.m_content;
    str.m_content.ptr = (char16_t *)this_01;
    JsUtil::
    BaseDictionary<Js::InternalString,UnifiedRegex::RegexStats*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<Js::InternalString,UnifiedRegex::RegexStats*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
              ((BaseDictionary<Js::InternalString,UnifiedRegex::RegexStats*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>
                *)this->map,(InternalString *)local_40,(RegexStats **)value);
  }
  else {
    value = (Type *)(this_00->entries + uVar1);
  }
  return (((CacheHashedEntry<Js::InternalString,_UnifiedRegex::RegexStats_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            *)&value->ptr)->super_KeyValueEntry<Js::InternalString,_UnifiedRegex::RegexStats_*>).
         super_ValueEntry<UnifiedRegex::RegexStats_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::InternalString,_UnifiedRegex::RegexStats_*>_>
         .super_KeyValueEntryDataLayout2<Js::InternalString,_UnifiedRegex::RegexStats_*>.value;
}

Assistant:

RegexStats* RegexStatsDatabase::GetRegexStats(RegexPattern* pattern)
    {
        Js::InternalString str = pattern->GetSource();
        RegexStats *res;
        if (!map->TryGetValue(str, &res))
        {
            res = Anew(allocator, RegexStats, pattern);
            map->Add(str, res);
        }
        return res;
    }